

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O0

void itranspose(double *A,int M,int N)

{
  double dVar1;
  int iVar2;
  void *pvVar3;
  double temp;
  double *buf;
  int iter;
  int p;
  int j;
  int i;
  int N_local;
  int M_local;
  double *A_local;
  
  if (M == N) {
    for (p = 0; iter = p, p < N; p = p + 1) {
      while (iter = iter + 1, iter < N) {
        dVar1 = A[p + iter * N];
        A[p + iter * N] = A[iter + p * N];
        A[iter + p * N] = dVar1;
      }
    }
  }
  else if (N < M) {
    iVar2 = M - N;
    pvVar3 = malloc((long)iVar2 * 8 * (long)N);
    memcpy(pvVar3,A + N * N,(long)iVar2 * 8 * (long)N);
    for (p = 0; iter = p, p < N; p = p + 1) {
      while (iter = iter + 1, iter < N) {
        dVar1 = A[p + iter * N];
        A[p + iter * N] = A[iter + p * N];
        A[iter + p * N] = dVar1;
      }
    }
    for (p = N + -1; 0 < p; p = p + -1) {
      memmove(A + p * M,A + p * N,(long)M << 3);
    }
    for (p = 0; p < N; p = p + 1) {
      for (iter = 0; iter < iVar2; iter = iter + 1) {
        A[N + p * M + iter] = *(double *)((long)pvVar3 + (long)(iter * N + p) * 8);
      }
    }
    free(pvVar3);
  }
  else if (M < N) {
    iVar2 = N - M;
    pvVar3 = malloc((long)iVar2 * 8 * (long)M);
    for (p = 0; p < M; p = p + 1) {
      for (iter = 0; iter < iVar2; iter = iter + 1) {
        *(double *)((long)pvVar3 + (long)(iter * M + p) * 8) = A[M + p * N + iter];
      }
    }
    for (p = 1; p < M; p = p + 1) {
      memmove(A + p * M,A + p * N,(long)M << 3);
    }
    for (p = 0; iter = p, p < M; p = p + 1) {
      while (iter = iter + 1, iter < M) {
        dVar1 = A[p + iter * M];
        A[p + iter * M] = A[iter + p * M];
        A[iter + p * M] = dVar1;
      }
    }
    memcpy(A + M * M,pvVar3,(long)iVar2 * 8 * (long)M);
    free(pvVar3);
  }
  return;
}

Assistant:

void itranspose(double *A, int M, int N) {
	int i, j, p, iter;
	double *buf;
	double temp;

	if (M == N) {
		for (i = 0; i < N; ++i) {
			for (j = i + 1; j < N; ++j) {
				temp = A[i + j*N];
				A[i + j*N] = A[j + i*N];
				A[j + i*N] = temp;
			}
		}
	} else if (M > N) {

		p = M - N;
		buf = (double*)malloc(sizeof(double)* p * N);

		memcpy(buf, A + N * N, sizeof(*A)*p*N);

		for (i = 0; i < N; ++i) {
			for (j = i + 1; j < N; ++j) {
				temp = A[i + j*N];
				A[i + j*N] = A[j + i*N];
				A[j + i*N] = temp;
			}
		}

		for (i = N - 1; i >= 1; --i) {
			memmove(A + i*M, A + i*N, sizeof(*A)*M);
		}


		for (i = 0; i < N; ++i) {
			iter = N + i * M;
			for (j = 0; j < p; ++j) {
				A[iter + j] = buf[j*N + i];
			}
		}

		free(buf);
	}
	else if (M < N) {
		p = N - M;
		buf = (double*)malloc(sizeof(double)* p * M);

		for (i = 0; i < M; ++i) {
			iter = M + i*N;
			for (j = 0; j < p; ++j) {
				buf[j*M + i] = A[iter + j];
			}
		}

		for (i = 1; i < M; ++i) {
			memmove(A + i*M, A + i * N, sizeof(*A)*M);
		}

		for (i = 0; i < M; ++i) {
			for (j = i + 1; j < M; ++j) {
				temp = A[i + j*M];
				A[i + j*M] = A[j + i*M];
				A[j + i*M] = temp;
			}
		}
		memcpy(A + M*M, buf, sizeof(*A)*p*M);
		free(buf);
	}
}